

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fglrx.c
# Opt level: O2

void decode_fglrx_ioctl_a6(fglrx_ioctl_a6 *d,mmt_memory_dump *args,int argc)

{
  uint uVar1;
  int iVar2;
  mmt_buf *buf;
  mmt_buf *buf_00;
  
  uVar1 = d->unk00;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("unk00");
    if (iVar2 != 0) goto LAB_0024bd7a;
  }
  else {
LAB_0024bd7a:
    fprintf(_stdout,"%sunk00: 0x%08x",fglrx_pfx,(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  uVar1 = d->unk04;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("unk04");
    if (iVar2 != 0) goto LAB_0024bdc3;
  }
  else {
LAB_0024bdc3:
    fprintf(_stdout,"%sunk04: 0x%08x",", ",(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  uVar1 = d->len1;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("len1");
    if (iVar2 != 0) goto LAB_0024be05;
  }
  else {
LAB_0024be05:
    fprintf(_stdout,"%slen1: %d",", ",(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  if (d->_pad0c != 0) {
    fprintf(_stdout,"%s%s_pad0c: 0x%08x%s",", ",colors->err,(ulong)d->_pad0c,colors->reset);
  }
  fglrx_pfx = ", ";
  if (d->ptr1 == 0) {
    iVar2 = _fglrx_field_enabled("ptr1");
    if (iVar2 == 0) goto LAB_0024befe;
    buf = (mmt_buf *)0x0;
    fprintf(_stdout,"%sptr1: %s",", ","NULL");
  }
  else {
    fprintf(_stdout,"%sptr1: 0x%016lx",", ");
    if (0 < argc) {
      buf = find_ptr(d->ptr1,args,argc);
      if (buf != (mmt_buf *)0x0) goto LAB_0024bf01;
    }
    fputs(" [no data]",_stdout);
LAB_0024befe:
    buf = (mmt_buf *)0x0;
  }
LAB_0024bf01:
  fglrx_pfx = ", ";
  uVar1 = d->len2;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("len2");
    if (iVar2 != 0) goto LAB_0024bf21;
  }
  else {
LAB_0024bf21:
    fprintf(_stdout,"%slen2: %d",", ",(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  if (d->_pad1c != 0) {
    fprintf(_stdout,"%s%s_pad1c: 0x%08x%s",", ",colors->err,(ulong)d->_pad1c,colors->reset);
  }
  fglrx_pfx = ", ";
  if (d->ptr2 == 0) {
    iVar2 = _fglrx_field_enabled("ptr2");
    if (iVar2 == 0) goto LAB_0024c01a;
    buf_00 = (mmt_buf *)0x0;
    fprintf(_stdout,"%sptr2: %s",", ","NULL");
  }
  else {
    fprintf(_stdout,"%sptr2: 0x%016lx",", ");
    if (0 < argc) {
      buf_00 = find_ptr(d->ptr2,args,argc);
      if (buf_00 != (mmt_buf *)0x0) goto LAB_0024c01d;
    }
    fputs(" [no data]",_stdout);
LAB_0024c01a:
    buf_00 = (mmt_buf *)0x0;
  }
LAB_0024c01d:
  fglrx_pfx = ", ";
  uVar1 = d->unk28;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("unk28");
    if (iVar2 != 0) goto LAB_0024c03b;
  }
  else {
LAB_0024c03b:
    fprintf(_stdout,"%sunk28: 0x%08x",", ",(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  uVar1 = d->unk2c;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("unk2c");
    if (iVar2 == 0) goto LAB_0024c09b;
  }
  fprintf(_stdout,"%sunk2c: 0x%08x",", ",(ulong)uVar1);
LAB_0024c09b:
  fglrx_pfx = ", ";
  fputc(10,_stdout);
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
  }
  if (buf != (mmt_buf *)0x0) {
    dump_mmt_buf_as_words_horiz(buf,"ptr1[]:");
  }
  if (buf_00 != (mmt_buf *)0x0) {
    dump_mmt_buf_as_words_horiz(buf_00,"ptr2[]:");
    return;
  }
  return;
}

Assistant:

static void decode_fglrx_ioctl_a6(struct fglrx_ioctl_a6 *d, struct mmt_memory_dump *args, int argc)
{
	fglrx_print_x32(d, unk00);
	fglrx_print_x32(d, unk04);
	fglrx_print_d32(d, len1);
	fglrx_print_pad_x32(d, _pad0c);
	struct mmt_buf *data1 = fglrx_print_ptr(d, ptr1, args, argc);
	fglrx_print_d32(d, len2);
	fglrx_print_pad_x32(d, _pad1c);
	struct mmt_buf *data2 = fglrx_print_ptr(d, ptr2, args, argc);
	fglrx_print_x32(d, unk28);
	fglrx_print_x32(d, unk2c);
	mmt_log_cont_nl();

	if (data1)
		dump_mmt_buf_as_words_horiz(data1, "ptr1[]:");
	if (data2)
		dump_mmt_buf_as_words_horiz(data2, "ptr2[]:");
}